

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void InsertDocType(TidyDocImpl *doc,Node *element,Node *doctype)

{
  Node *pNVar1;
  
  pNVar1 = prvTidyFindDocType(doc);
  if (pNVar1 != (Node *)0x0) {
    prvTidyReport(doc,element,doctype,0x235);
    prvTidyFreeNode(doc,doctype);
    return;
  }
  prvTidyReport(doc,element,doctype,0x236);
  while (((element == (Node *)0x0 || (element->tag == (Dict *)0x0)) ||
         (element->tag->id != TidyTag_HTML))) {
    element = element->parent;
  }
  prvTidyInsertNodeBeforeElement(element,doctype);
  return;
}

Assistant:

static void InsertDocType( TidyDocImpl* doc, Node *element, Node *doctype )
{
    Node* existing = TY_(FindDocType)( doc );
    if ( existing )
    {
        TY_(Report)(doc, element, doctype, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, doctype );
    }
    else
    {
        TY_(Report)(doc, element, doctype, DOCTYPE_AFTER_TAGS );
        while ( !nodeIsHTML(element) )
            element = element->parent;
        TY_(InsertNodeBeforeElement)( element, doctype );
    }
}